

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimfmt.cpp
# Opt level: O1

void __thiscall
icu_63::DecimalFormat::setRoundingMode(DecimalFormat *this,ERoundingMode roundingMode)

{
  DecimalFormatProperties *pDVar1;
  uint in_EAX;
  UErrorCode localStatus;
  undefined8 uStack_18;
  
  pDVar1 = (this->fields->properties).
           super_LocalPointerBase<icu_63::number::impl::DecimalFormatProperties>.ptr;
  if (((pDVar1->roundingMode).fNull != false) || ((pDVar1->roundingMode).fValue != roundingMode)) {
    uStack_18._0_4_ = in_EAX;
    NumberFormat::setMaximumIntegerDigits(&this->super_NumberFormat,roundingMode);
    pDVar1 = (this->fields->properties).
             super_LocalPointerBase<icu_63::number::impl::DecimalFormatProperties>.ptr;
    (pDVar1->roundingMode).fValue = roundingMode;
    (pDVar1->roundingMode).fNull = false;
    uStack_18 = (ulong)(uint)uStack_18;
    touch(this,(UErrorCode *)((long)&uStack_18 + 4));
  }
  return;
}

Assistant:

void DecimalFormat::setRoundingMode(ERoundingMode roundingMode) {
    auto uRoundingMode = static_cast<UNumberFormatRoundingMode>(roundingMode);
    if (!fields->properties->roundingMode.isNull() && uRoundingMode == fields->properties->roundingMode.getNoError()) {
        return;
    }
    NumberFormat::setMaximumIntegerDigits(roundingMode); // to set field for compatibility
    fields->properties->roundingMode = uRoundingMode;
    touchNoError();
}